

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_meshb_cell_bcast
          (REF_CELL ref_cell,REF_GLOB ncell,REF_NODE ref_node,REF_INT version,FILE *file)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  REF_STATUS RVar8;
  ulong uVar9;
  void *data;
  void *pvVar10;
  void *__ptr;
  size_t sVar11;
  long lVar12;
  size_t __n;
  void *pvVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  int iVar21;
  bool bVar22;
  REF_INT local;
  REF_INT new_cell;
  REF_INT nodes [27];
  ulong local_148;
  uint local_118;
  int local_114;
  FILE *local_110;
  REF_GLOB local_108;
  REF_MPI local_100;
  ulong local_f8;
  void *local_f0;
  long local_e8;
  void *local_e0;
  long local_d8;
  REF_CELL local_d0;
  size_t local_c8;
  ulong local_c0;
  long local_b8;
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  local_100 = ref_node->ref_mpi;
  uVar9 = ncell / (long)local_100->n;
  local_f8 = 1000000;
  if (1000000 < (long)uVar9) {
    local_f8 = uVar9;
  }
  uVar4 = ref_cell->size_per;
  uVar6 = uVar4 * (int)local_f8;
  if ((int)uVar6 < 0) {
    pcVar20 = "malloc c2n of REF_GLOB negative";
    uVar14 = 0x275;
LAB_0017c194:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
           "ref_part_meshb_cell_bcast",pcVar20);
LAB_0017c19b:
    RVar8 = 1;
  }
  else {
    uVar5 = ref_cell->node_per;
    lVar17 = (long)(int)uVar5;
    data = malloc((ulong)uVar6 << 3);
    if (data == (void *)0x0) {
      pcVar20 = "malloc c2n of REF_GLOB NULL";
      uVar14 = 0x275;
    }
    else {
      iVar7 = (int)(lVar17 + 1);
      uVar6 = iVar7 * (int)local_f8;
      if ((int)uVar6 < 0) {
        pcVar20 = "malloc c2n_int of REF_INT negative";
        uVar14 = 0x276;
        goto LAB_0017c194;
      }
      local_108 = ncell;
      pvVar10 = malloc((ulong)uVar6 * 4);
      if (pvVar10 == (void *)0x0) {
        pcVar20 = "malloc c2n_int of REF_INT NULL";
        uVar14 = 0x276;
      }
      else {
        __ptr = malloc((ulong)uVar6 << 3);
        if (__ptr != (void *)0x0) {
          local_110 = (FILE *)file;
          if (0 < local_108) {
            local_d8 = (long)(int)uVar4;
            uVar9 = (ulong)uVar5;
            local_c8 = (ulong)uVar4 * 8;
            local_e0 = (void *)((long)data + lVar17 * 8);
            lVar2 = local_d8 * 8;
            local_b8 = (lVar17 + 1) * 4;
            lVar12 = 0;
            local_f0 = pvVar10;
            local_d0 = ref_cell;
            do {
              pvVar10 = local_f0;
              uVar6 = (int)local_108 - (int)lVar12;
              uVar16 = (ulong)uVar6;
              if ((int)local_f8 < (int)uVar6) {
                uVar16 = local_f8 & 0xffffffff;
              }
              iVar15 = (int)uVar16;
              local_e8 = lVar12;
              if (local_100->id == 0) {
                __n = (size_t)(iVar15 * iVar7);
                if (version < 4) {
                  sVar11 = fread(local_f0,4,__n,local_110);
                  if (sVar11 != __n) {
                    pcVar20 = "int c2n";
                    uVar14 = 0x27f;
LAB_0017c2d2:
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar14,"ref_part_meshb_cell_bcast",pcVar20,__n,sVar11);
                    goto LAB_0017c19b;
                  }
                  if (0 < iVar15) {
                    uVar18 = 0;
                    pvVar13 = data;
                    do {
                      if (0 < (int)uVar4) {
                        uVar19 = 0;
                        do {
                          *(long *)((long)pvVar13 + uVar19 * 8) =
                               (long)*(int *)((long)pvVar10 + uVar19 * 4);
                          uVar19 = uVar19 + 1;
                        } while (uVar4 != uVar19);
                      }
                      uVar18 = uVar18 + 1;
                      pvVar13 = (void *)((long)pvVar13 + lVar2);
                      pvVar10 = (void *)((long)pvVar10 + local_b8);
                    } while (uVar18 != uVar16);
LAB_0017c0ef:
                    if (0 < iVar15) {
                      uVar18 = 0;
                      pvVar10 = data;
                      do {
                        if (0 < (int)uVar5) {
                          uVar19 = 0;
                          do {
                            plVar1 = (long *)((long)pvVar10 + uVar19 * 8);
                            *plVar1 = *plVar1 + -1;
                            uVar19 = uVar19 + 1;
                          } while (uVar9 != uVar19);
                        }
                        uVar18 = uVar18 + 1;
                        pvVar10 = (void *)((long)pvVar10 + lVar2);
                      } while (uVar18 != uVar16);
                    }
                  }
                }
                else {
                  sVar11 = fread(__ptr,8,__n,local_110);
                  if (sVar11 != __n) {
                    pcVar20 = "long c2n";
                    uVar14 = 0x285;
                    goto LAB_0017c2d2;
                  }
                  if (0 < iVar15) {
                    uVar19 = 0;
                    iVar21 = 0;
                    uVar18 = uVar16;
                    do {
                      if (0 < (int)uVar4) {
                        memcpy((void *)((long)data + uVar19 * 8),
                               (void *)((long)__ptr + (long)iVar21 * 8),local_c8);
                      }
                      iVar21 = iVar21 + iVar7;
                      uVar19 = (ulong)((int)uVar19 + uVar4);
                      uVar18 = uVar18 - 1;
                    } while (uVar18 != 0);
                    goto LAB_0017c0ef;
                  }
                }
              }
              uVar6 = ref_mpi_bcast(local_100,data,iVar15 * uVar4,2);
              if (uVar6 != 0) {
                pcVar20 = "broadcast read c2n";
                uVar14 = 0x28f;
LAB_0017c272:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar14,"ref_part_meshb_cell_bcast",(ulong)uVar6,pcVar20);
                return uVar6;
              }
              if (0 < iVar15) {
                local_148 = 0;
                pvVar10 = data;
                local_c0 = uVar16;
                do {
                  if (0 < (int)uVar5) {
                    uVar16 = 0;
                    do {
                      uVar6 = ref_node_local(ref_node,*(REF_GLOB *)((long)pvVar10 + uVar16 * 8),
                                             &local_114);
                      if ((uVar6 != 0) && (uVar6 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x296,"ref_part_meshb_cell_bcast",(ulong)uVar6,"local");
                        local_118 = uVar6;
                      }
                      if ((uVar6 != 5) && (uVar6 != 0)) {
                        return local_118;
                      }
                      if (local_114 == -1) goto LAB_0017bfcd;
                      local_a8[uVar16] = local_114;
                      uVar16 = uVar16 + 1;
                    } while (uVar9 != uVar16);
                  }
                  if (uVar5 != uVar4) {
                    local_a8[lVar17] = *(REF_INT *)((long)local_e0 + local_148 * local_d8 * 8);
                  }
                  if (0 < (int)uVar5) {
                    uVar16 = 0;
                    bVar22 = false;
                    do {
                      while (bVar22) {
                        uVar16 = uVar16 + 1;
                        bVar22 = true;
                        if (uVar16 == uVar9) goto LAB_0017bfad;
                      }
                      iVar21 = ref_node->ref_mpi->id;
                      piVar3 = local_a8 + uVar16;
                      bVar22 = iVar21 == ref_node->part[*piVar3];
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != uVar9);
                    if (iVar21 == ref_node->part[*piVar3]) {
LAB_0017bfad:
                      uVar6 = ref_cell_add(local_d0,local_a8,&local_ac);
                      if (uVar6 != 0) {
                        pcVar20 = "add";
                        uVar14 = 0x2a7;
                        goto LAB_0017c272;
                      }
                    }
                  }
LAB_0017bfcd:
                  local_148 = local_148 + 1;
                  pvVar10 = (void *)((long)pvVar10 + lVar2);
                } while (local_148 != local_c0);
              }
              lVar12 = local_e8 + iVar15;
              pvVar10 = local_f0;
            } while (lVar12 < local_108);
          }
          free(__ptr);
          free(pvVar10);
          free(data);
          return 0;
        }
        pcVar20 = "malloc c2n_long of REF_LONG NULL";
        uVar14 = 0x277;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
           "ref_part_meshb_cell_bcast",pcVar20);
    RVar8 = 2;
  }
  return RVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell_bcast(REF_CELL ref_cell,
                                                    REF_GLOB ncell,
                                                    REF_NODE ref_node,
                                                    REF_INT version,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB ncell_read;
  REF_INT chunk;
  REF_INT section_size;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_INT node_per, size_per;
  REF_INT cell, node, local, new_cell;
  REF_BOOL have_all_nodes, one_node_local;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(c2n, size_per * chunk, REF_GLOB);
  ref_malloc(c2n_int, (1 + node_per) * chunk, REF_INT);
  ref_malloc(c2n_long, (1 + node_per) * chunk, REF_LONG);

  ncell_read = 0;
  while (ncell_read < ncell) {
    section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
    if (ref_mpi_once(ref_mpi)) {
      nread = (size_t)(section_size * (1 + node_per));
      if (version < 4) {
        REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file), "long c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, c2n, size_per * section_size, REF_GLOB_TYPE),
        "broadcast read c2n");

    /* convert to local nodes and add if local */
    for (cell = 0; cell < section_size; cell++) {
      have_all_nodes = REF_TRUE;
      for (node = 0; node < node_per; node++) {
        RXS(ref_node_local(ref_node, c2n[node + size_per * cell], &local),
            REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          nodes[node] = local;
        } else {
          have_all_nodes = REF_FALSE;
          break;
        }
      }
      if (have_all_nodes) {
        if (node_per != size_per)
          nodes[node_per] = (REF_INT)c2n[node_per + size_per * cell];
        one_node_local = REF_FALSE;
        for (node = 0; node < node_per; node++) {
          one_node_local =
              (one_node_local || ref_node_owned(ref_node, nodes[node]));
        }
        if (one_node_local)
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");
      }
    }

    ncell_read += section_size;
  }

  free(c2n_long);
  free(c2n_int);
  free(c2n);

  return REF_SUCCESS;
}